

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatdesc.h
# Opt level: O2

uint32_t __thiscall FormatDescriptor::channelUpper(FormatDescriptor *this)

{
  pointer psVar1;
  runtime_error *this_00;
  
  psVar1 = (this->samples).
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->samples).
            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4 ==
      (ulong)(this->extended).channelCount) {
    if ((this->extended).sameUnitAllChannels != false) {
      return psVar1->upper;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Differing size channels. Call sampleUpper(uint32_t s).");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Multiple samples per channel. Call sampleUpper(uint32_t s).");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t channelUpper() const {
        if (extended.channelCount != samples.size()) {
            throw std::runtime_error(
                "Multiple samples per channel. Call sampleUpper(uint32_t s)."
            );
        }
        if (!extended.sameUnitAllChannels) {
            throw std::runtime_error(
                "Differing size channels. Call sampleUpper(uint32_t s)."
            );
        }
        return sampleUpper(KHR_DF_CHANNEL_RGBSDA_R);
    }